

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

void __thiscall cmGlobalNinjaGenerator::AddMacOSXContentRule(cmGlobalNinjaGenerator *this)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  cmNinjaRule rule;
  string local_1c0;
  char *local_1a0;
  size_type local_198;
  char local_190 [8];
  undefined8 uStack_188;
  string local_180;
  undefined1 local_160 [32];
  _Alloc_hider local_140;
  size_type local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  _Alloc_hider local_120;
  char *local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  _Alloc_hider local_100;
  char *local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  _Alloc_hider local_e0;
  size_type local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  _Alloc_hider local_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  _Alloc_hider local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  _Alloc_hider local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  _Alloc_hider local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  bool local_40;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  undefined8 local_28;
  char *local_20;
  
  local_1a0 = local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"COPY_OSX_CONTENT","");
  local_160._0_8_ = local_160 + 0x10;
  if (local_1a0 == local_190) {
    local_160._24_8_ = uStack_188;
  }
  else {
    local_160._0_8_ = local_1a0;
  }
  local_140._M_p = (pointer)&local_130;
  local_160._8_8_ = local_198;
  local_198 = 0;
  local_190[0] = '\0';
  local_138 = 0;
  local_130._M_local_buf[0] = '\0';
  local_120._M_p = (pointer)&local_110;
  local_118 = (char *)0x0;
  local_110._M_local_buf[0] = '\0';
  local_100._M_p = (pointer)&local_f0;
  local_f8 = (char *)0x0;
  local_f0._M_local_buf[0] = '\0';
  local_e0._M_p = (pointer)&local_d0;
  local_d8 = 0;
  local_d0._M_local_buf[0] = '\0';
  local_c0._M_p = (pointer)&local_b0;
  local_b8 = 0;
  local_b0._M_local_buf[0] = '\0';
  local_a0._M_p = (pointer)&local_90;
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_80._M_p = (pointer)&local_70;
  local_78 = 0;
  local_70._M_local_buf[0] = '\0';
  local_60._M_p = (pointer)&local_50;
  local_58 = 0;
  local_50._M_local_buf[0] = '\0';
  local_40 = false;
  local_1a0 = local_190;
  CMakeCmd_abi_cxx11_(&local_1c0,this);
  local_38._M_len = local_1c0._M_string_length;
  local_38._M_str = local_1c0._M_dataplus._M_p;
  local_28 = 0x11;
  local_20 = " -E copy $in $out";
  views._M_len = 2;
  views._M_array = &local_38;
  cmCatViews_abi_cxx11_(&local_180,views);
  std::__cxx11::string::operator=((string *)&local_140,(string *)&local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_replace((ulong)&local_120,0,local_118,0x792247);
  std::__cxx11::string::_M_replace((ulong)&local_100,0,local_f8,0x792261);
  AddRule(this,(cmNinjaRule *)local_160);
  cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_160);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::AddMacOSXContentRule()
{
  cmNinjaRule rule("COPY_OSX_CONTENT");
  rule.Command = cmStrCat(this->CMakeCmd(), " -E copy $in $out");
  rule.Description = "Copying OS X Content $out";
  rule.Comment = "Rule for copying OS X bundle content file.";
  this->AddRule(rule);
}